

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestCase.cpp
# Opt level: O3

IterateResult __thiscall deqp::gles3::Functional::FboTestCase::iterate(FboTestCase *this)

{
  ContextWrapper *this_00;
  int iVar1;
  RenderContext *context_00;
  TestLog *log;
  int width;
  int height;
  int iVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  Error *this_01;
  char *description;
  Surface result;
  Surface reference;
  Random rnd;
  ReferenceContextBuffers buffers;
  GLContext context;
  Surface local_6390;
  Surface local_6378;
  PixelBufferAccess local_6360;
  deRandom local_6338;
  ReferenceContextBuffers local_6328;
  ReferenceContextLimits local_62b0;
  MultisamplePixelBufferAccess local_6258;
  MultisamplePixelBufferAccess local_6230;
  MultisamplePixelBufferAccess local_6208;
  ReferenceContext local_61e0;
  int *piVar5;
  
  context_00 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*context_00->_vptr_RenderContext[4])();
  piVar5 = (int *)CONCAT44(extraout_var,iVar2);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  dVar3 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&local_6338,dVar3);
  iVar2 = *piVar5;
  width = this->m_viewportWidth;
  if (iVar2 < this->m_viewportWidth) {
    width = iVar2;
  }
  height = this->m_viewportHeight;
  if (piVar5[1] < this->m_viewportHeight) {
    height = piVar5[1];
  }
  dVar3 = deRandom_getUint32(&local_6338);
  iVar1 = piVar5[1];
  dVar4 = deRandom_getUint32(&local_6338);
  tcu::Surface::Surface(&local_6378);
  tcu::Surface::Surface(&local_6390);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  local_6328.m_colorbuffer.m_format.order = dVar3 % ((iVar2 - width) + 1U);
  local_6328.m_colorbuffer.m_format.type = dVar4 % ((iVar1 - height) + 1U);
  local_6328.m_colorbuffer.m_size.m_data[0] = width;
  local_6328.m_colorbuffer.m_size.m_data[1] = height;
  sglr::GLContext::GLContext((GLContext *)&local_61e0,context_00,log,1,(IVec4 *)&local_6328);
  this_00 = &this->super_ContextWrapper;
  sglr::ContextWrapper::setContext(this_00,&local_61e0.super_Context);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  dVar3 = sglr::ContextWrapper::glGetError(this_00);
  if (dVar3 == 0) {
    sglr::ContextWrapper::setContext(this_00,(Context *)0x0);
    sglr::GLContext::~GLContext((GLContext *)&local_61e0);
    local_61e0.super_Context._12_4_ = (uint)(piVar5[5] != 0) << 3;
    local_61e0.super_Context._vptr_Context = (_func_int **)0x800000008;
    local_61e0.super_Context.m_type.super_ApiType.m_bits = (ApiType)8;
    sglr::ReferenceContextBuffers::ReferenceContextBuffers
              (&local_6328,(PixelFormat *)&local_61e0,piVar5[6],piVar5[7],width,height,1);
    sglr::ReferenceContextLimits::ReferenceContextLimits(&local_62b0,context_00);
    tcu::TextureLevel::getAccess(&local_6360,&local_6328.m_colorbuffer);
    rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_6360);
    tcu::TextureLevel::getAccess(&local_6360,&local_6328.m_depthbuffer);
    rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_6360);
    tcu::TextureLevel::getAccess(&local_6360,&local_6328.m_stencilbuffer);
    rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_6360);
    sglr::ReferenceContext::ReferenceContext
              (&local_61e0,&local_62b0,&local_6208,&local_6230,&local_6258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_62b0.extensionStr._M_dataplus._M_p != &local_62b0.extensionStr.field_2) {
      operator_delete(local_62b0.extensionStr._M_dataplus._M_p,
                      local_62b0.extensionStr.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_62b0 + 0x20));
    sglr::ContextWrapper::setContext(this_00,&local_61e0.super_Context);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
    sglr::ContextWrapper::setContext(this_00,(Context *)0x0);
    sglr::ReferenceContext::~ReferenceContext(&local_61e0);
    tcu::TextureLevel::~TextureLevel(&local_6328.m_stencilbuffer);
    tcu::TextureLevel::~TextureLevel(&local_6328.m_depthbuffer);
    tcu::TextureLevel::~TextureLevel(&local_6328.m_colorbuffer);
    iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])
                      (this,&local_6378,&local_6390);
    description = "Image comparison failed";
    if ((byte)iVar2 != 0) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)(byte)((byte)iVar2 ^ 1),description);
    tcu::Surface::~Surface(&local_6390);
    tcu::Surface::~Surface(&local_6378);
    return STOP;
  }
  this_01 = (Error *)__cxa_allocate_exception(0x38);
  local_62b0._0_8_ = glu::getErrorName;
  local_62b0.maxTexture2DSize = dVar3;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_((string *)&local_6328,&local_62b0);
  glu::Error::Error(this_01,dVar3,
                    (char *)CONCAT44(local_6328.m_colorbuffer.m_format.type,
                                     local_6328.m_colorbuffer.m_format.order),(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboTestCase.cpp"
                    ,0x5a);
  __cxa_throw(this_01,&glu::Error::typeinfo,glu::Error::~Error);
}

Assistant:

FboTestCase::IterateResult FboTestCase::iterate (void)
{
	glu::RenderContext&			renderCtx		= TestCase::m_context.getRenderContext();
	const tcu::RenderTarget&	renderTarget	= renderCtx.getRenderTarget();
	TestLog&					log				= m_testCtx.getLog();

	// Viewport.
	de::Random					rnd				(deStringHash(getName()));
	int							width			= deMin32(renderTarget.getWidth(),	m_viewportWidth);
	int							height			= deMin32(renderTarget.getHeight(),	m_viewportHeight);
	int							x				= rnd.getInt(0, renderTarget.getWidth()		- width);
	int							y				= rnd.getInt(0, renderTarget.getHeight()	- height);

	// Surface format and storage is choosen by render().
	tcu::Surface				reference;
	tcu::Surface				result;

	// Call preCheck() that can throw exception if some requirement is not met.
	preCheck();

	// Render using GLES3.
	try
	{
		sglr::GLContext context(renderCtx, log, sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(x, y, width, height));
		setContext(&context);
		render(result);

		// Check error.
		deUint32 err = glGetError();
		if (err != GL_NO_ERROR)
			throw glu::Error(err, glu::getErrorStr(err).toString().c_str(), DE_NULL, __FILE__, __LINE__);

		setContext(DE_NULL);
	}
	catch (const FboTestUtil::FboIncompleteException& e)
	{
		if (e.getReason() == GL_FRAMEBUFFER_UNSUPPORTED)
		{
			log << e;
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
			return STOP;
		}
		else
			throw;
	}

	// Render reference.
	{
		sglr::ReferenceContextBuffers	buffers	(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), renderTarget.getDepthBits(), renderTarget.getStencilBits(), width, height);
		sglr::ReferenceContext			context	(sglr::ReferenceContextLimits(renderCtx), buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());

		setContext(&context);
		render(reference);
		setContext(DE_NULL);
	}

	bool isOk = compare(reference, result);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");
	return STOP;
}